

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Polyn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  Vec_Int_t *local_68;
  uint local_54;
  uint local_50;
  int fVeryVerbose;
  int fVerbose;
  int fSigned;
  int fSimple;
  int fOld;
  int nExtra;
  int c;
  char *pSign;
  Vec_Int_t *vOrder;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pSign = (char *)0x0;
  _nExtra = (char *)0x0;
  fSimple = 0;
  bVar1 = false;
  bVar2 = true;
  fVeryVerbose = 0;
  local_50 = 0;
  local_54 = 0;
  vOrder = (Vec_Int_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  do {
    iVar3 = Extra_UtilGetopt(argv_local._4_4_,(char **)vOrder,"NSoasvwh");
    if (iVar3 == -1) {
      if (pAStack_18->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Esop(): There is no AIG.\n");
        return 0;
      }
      if (globalUtilOptind + 1 <= argv_local._4_4_) {
        printf("Trailing symbols on the command line (\"%s\").\n",
               *(undefined8 *)(&vOrder->nCap + (long)globalUtilOptind * 2));
        return 0;
      }
      if (bVar1) {
        if (bVar2) {
          local_68 = (Vec_Int_t *)0x0;
        }
        else {
          local_68 = Gia_PolynReorder(pAStack_18->pGia,local_50,local_54);
        }
        pSign = (char *)local_68;
        Gia_PolynBuild(pAStack_18->pGia,local_68,fVeryVerbose,local_50,local_54);
        Vec_IntFreeP((Vec_Int_t **)&pSign);
      }
      else {
        Gia_PolynBuild2Test(pAStack_18->pGia,_nExtra,fSimple,fVeryVerbose,local_50,local_54);
      }
      return 0;
    }
    switch(iVar3) {
    case 0x4e:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002c3203;
      }
      fSimple = atoi(*(char **)(&vOrder->nCap + (long)globalUtilOptind * 2));
      globalUtilOptind = globalUtilOptind + 1;
      if (fSimple < 0) {
LAB_002c3203:
        Abc_Print(-2,"usage: &polyn [-N num] [-oasvwh] [-S str]\n");
        Abc_Print(-2,"\t         derives algebraic polynomial from AIG\n");
        Abc_Print(-2,
                  "\t-N num : the number of additional primary outputs (-1 = unused) [default = %d]\n"
                  ,(ulong)(uint)fSimple);
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-o     : toggles old computation [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar2) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggles simple computation [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fVeryVerbose != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggles signed computation [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (local_50 != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (local_54 != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-w     : toggles printing very verbose information [default = %s]\n",pcVar4)
        ;
        Abc_Print(-2,"\t-h     : print the command usage\n");
        Abc_Print(-2,"\t\n");
        Abc_Print(-2,"\t-S str : (optional) the output signature as a character string\n");
        Abc_Print(-2,
                  "\t         The format used to represent the output signature is very restrictive.\n"
                 );
        Abc_Print(-2,
                  "\t         It should be a string without spaces containing monomials in terms of\n"
                 );
        Abc_Print(-2,
                  "\t         inputs (i<num>) and outputs (o<num>) where <num> is 0-based. Coefficients\n"
                 );
        Abc_Print(-2,
                  "\t         are degrees of two, represented by log2 of their value: for example, \n"
                 );
        Abc_Print(-2,"\t         \"2\" is 2^2 = 4, \"-4\" is -2^4=-16, \"-0\" is -2^0=-1, etc\n");
        Abc_Print(-2,"\t         Two types of signature are accepted:\n");
        Abc_Print(-2,
                  "\t         (1) a sequence of monomials without parentheses (for example, \"-2*o0+1*o1+0*o2\")\n"
                 );
        Abc_Print(-2,"\t         (2) a product of two sequences followed by a sum with a sequence\n"
                 );
        Abc_Print(-2,
                  "\t             (for example, \"(4*o0+2*o1+1*o2)*(4*i3+2*i4+1*i5)+(4*o3+2*o4+1*o5)\")\n"
                 );
        Abc_Print(-2,
                  "\t         Here is the signature of a signed 2-bit multiplier: \"(0*o0+1*o1+2*o2-3*o3)\"\n"
                 );
        return 1;
      }
      break;
    default:
      goto LAB_002c3203;
    case 0x53:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,
                  "Command line switch \"-S\" should be followed by a char string without spaces.\n"
                 );
        goto LAB_002c3203;
      }
      _nExtra = *(char **)(&vOrder->nCap + (long)globalUtilOptind * 2);
      globalUtilOptind = globalUtilOptind + 1;
      break;
    case 0x61:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x68:
      goto LAB_002c3203;
    case 0x6f:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x73:
      fVeryVerbose = fVeryVerbose ^ 1;
      break;
    case 0x76:
      local_50 = local_50 ^ 1;
      break;
    case 0x77:
      local_54 = local_54 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Polyn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_PolynBuild2Test( Gia_Man_t * pGia, char * pSign, int nExtra, int fSigned, int fVerbose, int fVeryVerbose );
    Vec_Int_t * vOrder = NULL; char * pSign = NULL;
    int c, nExtra = 0, fOld = 0, fSimple = 1, fSigned = 0, fVerbose = 0, fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSoasvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nExtra = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nExtra < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a char string without spaces.\n" );
                goto usage;
            }
            pSign = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'o':
            fOld ^= 1;
            break;
        case 'a':
            fSimple ^= 1;
            break;
        case 's':
            fSigned ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Esop(): There is no AIG.\n" );
        return 0;
    }
    if ( argc >= globalUtilOptind + 1 )
    {
        printf( "Trailing symbols on the command line (\"%s\").\n", argv[globalUtilOptind] );
        return 0;
    }
    if ( fOld )
    {
        vOrder = fSimple ? NULL : Gia_PolynReorder( pAbc->pGia, fVerbose, fVeryVerbose );
        Gia_PolynBuild( pAbc->pGia, vOrder, fSigned, fVerbose, fVeryVerbose );
        Vec_IntFreeP( &vOrder );
    }
    else
        Gia_PolynBuild2Test( pAbc->pGia, pSign, nExtra, fSigned, fVerbose, fVeryVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &polyn [-N num] [-oasvwh] [-S str]\n" );
    Abc_Print( -2, "\t         derives algebraic polynomial from AIG\n" );
    Abc_Print( -2, "\t-N num : the number of additional primary outputs (-1 = unused) [default = %d]\n", nExtra );
    Abc_Print( -2, "\t-o     : toggles old computation [default = %s]\n",  fOld? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggles simple computation [default = %s]\n",  fSimple? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles signed computation [default = %s]\n",  fSigned? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggles printing very verbose information [default = %s]\n",  fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t\n");
    Abc_Print( -2, "\t-S str : (optional) the output signature as a character string\n" );
    Abc_Print( -2, "\t         The format used to represent the output signature is very restrictive.\n" );
    Abc_Print( -2, "\t         It should be a string without spaces containing monomials in terms of\n" );
    Abc_Print( -2, "\t         inputs (i<num>) and outputs (o<num>) where <num> is 0-based. Coefficients\n" );
    Abc_Print( -2, "\t         are degrees of two, represented by log2 of their value: for example, \n" );
    Abc_Print( -2, "\t         \"2\" is 2^2 = 4, \"-4\" is -2^4=-16, \"-0\" is -2^0=-1, etc\n" );
    Abc_Print( -2, "\t         Two types of signature are accepted:\n" );
    Abc_Print( -2, "\t         (1) a sequence of monomials without parentheses (for example, \"-2*o0+1*o1+0*o2\")\n" );
    Abc_Print( -2, "\t         (2) a product of two sequences followed by a sum with a sequence\n" );
    Abc_Print( -2, "\t             (for example, \"(4*o0+2*o1+1*o2)*(4*i3+2*i4+1*i5)+(4*o3+2*o4+1*o5)\")\n" );
    Abc_Print( -2, "\t         Here is the signature of a signed 2-bit multiplier: \"(0*o0+1*o1+2*o2-3*o3)\"\n" );
    return 1;
}